

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

QRectF * __thiscall
QGraphicsPathItem::boundingRect(QRectF *__return_storage_ptr__,QGraphicsPathItem *this)

{
  ExtraStruct **ppEVar1;
  double dVar2;
  QGraphicsItemPrivate *pQVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  qsizetype qVar10;
  int iVar11;
  QAbstractGraphicsShapeItemPrivate *d;
  long in_FS_OFFSET;
  ExtraStruct *local_58;
  qsizetype qStack_50;
  qreal local_48;
  qreal qStack_40;
  QPen local_38 [8];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (this->super_QAbstractGraphicsShapeItem).super_QGraphicsItem.d_ptr.d;
  ppEVar1 = &pQVar3[1].extras.d.ptr;
  dVar2 = pQVar3[1].childrenBoundingRect.xp;
  if ((((dVar2 == 0.0) && (!NAN(dVar2))) &&
      (dVar2 = pQVar3[1].childrenBoundingRect.yp, dVar2 == 0.0)) && (!NAN(dVar2))) {
    QPen::QPen((QPen *)&local_58,(QPen *)&pQVar3[1].extras);
    iVar11 = QPen::style();
    if (iVar11 == 0) {
      QPen::~QPen((QPen *)&local_58);
    }
    else {
      QPen::QPen(local_38,(QPen *)&(this->super_QAbstractGraphicsShapeItem).super_QGraphicsItem.
                                   d_ptr.d[1].extras);
      dVar2 = (double)QPen::widthF();
      QPen::~QPen(local_38);
      QPen::~QPen((QPen *)&local_58);
      if ((dVar2 != 0.0) || (NAN(dVar2))) {
        (*(this->super_QAbstractGraphicsShapeItem).super_QGraphicsItem._vptr_QGraphicsItem[4])
                  ((QPainterPath *)local_38,this);
        QPainterPath::controlPointRect();
        pQVar3[1].childrenBoundingRect.xp = local_48;
        pQVar3[1].childrenBoundingRect.yp = qStack_40;
        *ppEVar1 = local_58;
        pQVar3[1].extras.d.size = qStack_50;
        QPainterPath::~QPainterPath((QPainterPath *)local_38);
        goto LAB_005e3ed4;
      }
    }
    QPainterPath::controlPointRect();
    pQVar3[1].childrenBoundingRect.xp = local_48;
    pQVar3[1].childrenBoundingRect.yp = qStack_40;
    *ppEVar1 = local_58;
    pQVar3[1].extras.d.size = qStack_50;
  }
LAB_005e3ed4:
  uVar4 = *(undefined4 *)ppEVar1;
  uVar5 = *(undefined4 *)((long)&pQVar3[1].extras.d.ptr + 4);
  qVar10 = pQVar3[1].extras.d.size;
  uVar6 = *(undefined4 *)((long)&pQVar3[1].extras.d.size + 4);
  uVar7 = *(undefined4 *)((long)&pQVar3[1].childrenBoundingRect.xp + 4);
  uVar8 = *(undefined4 *)&pQVar3[1].childrenBoundingRect.yp;
  uVar9 = *(undefined4 *)((long)&pQVar3[1].childrenBoundingRect.yp + 4);
  *(undefined4 *)&__return_storage_ptr__->w = *(undefined4 *)&pQVar3[1].childrenBoundingRect.xp;
  *(undefined4 *)((long)&__return_storage_ptr__->w + 4) = uVar7;
  *(undefined4 *)&__return_storage_ptr__->h = uVar8;
  *(undefined4 *)((long)&__return_storage_ptr__->h + 4) = uVar9;
  *(undefined4 *)&__return_storage_ptr__->xp = uVar4;
  *(undefined4 *)((long)&__return_storage_ptr__->xp + 4) = uVar5;
  *(int *)&__return_storage_ptr__->yp = (int)qVar10;
  *(undefined4 *)((long)&__return_storage_ptr__->yp + 4) = uVar6;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QGraphicsPathItem::boundingRect() const
{
    Q_D(const QGraphicsPathItem);
    if (d->boundingRect.isNull()) {
        qreal pw = pen().style() == Qt::NoPen ? qreal(0) : pen().widthF();
        if (pw == 0.0)
            d->boundingRect = d->path.controlPointRect();
        else {
            d->boundingRect = shape().controlPointRect();
        }
    }
    return d->boundingRect;
}